

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mFILE.c
# Opt level: O1

void init_mstdin(void)

{
  long lVar1;
  char *pcVar2;
  int in_ECX;
  
  if (init_mstdin_done_stdin == '\0') {
    pcVar2 = mfload(_stdin,(char *)0x0,(size_t *)(m_channel_0 + 0x20),in_ECX);
    lVar1 = m_channel_0;
    *(char **)(m_channel_0 + 8) = pcVar2;
    *(undefined4 *)(lVar1 + 0x1c) = 1;
    init_mstdin_done_stdin = '\x01';
  }
  return;
}

Assistant:

static void init_mstdin(void) {
    static int done_stdin = 0;
    if (done_stdin)
	return;

    m_channel[0]->data = mfload(stdin, NULL, &m_channel[0]->size, 1);
    m_channel[0]->mode = MF_READ;
    done_stdin = 1;
}